

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::EnumDescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  _func_int **pp_Var1;
  MessageLite *to_msg_00;
  ulong uVar2;
  void *pvVar3;
  Arena *extraout_RDX;
  Arena *arena;
  uint unaff_EBP;
  string *value;
  MessageLite *pMVar4;
  Arena *arena_00;
  
  arena_00 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena_00 & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    pMVar4 = from_msg;
    MergeImpl();
    arena = extraout_RDX;
LAB_0020f95f:
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
LAB_0020f8cc:
    internal::ArenaStringPtr::Set<>((ArenaStringPtr *)pMVar4,value,arena);
  }
  else {
    if (*(int *)&from_msg[2]._vptr_MessageLite != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[1]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[1]._internal_metadata_,
                 Arena::CopyConstruct<google::protobuf::EnumValueDescriptorProto>);
    }
    if ((int)from_msg[3]._internal_metadata_.ptr_ != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)(to_msg + 3),(RepeatedPtrFieldBase *)(from_msg + 3),
                 Arena::CopyConstruct<google::protobuf::EnumDescriptorProto_EnumReservedRange>);
    }
    if (*(int *)&from_msg[5]._vptr_MessageLite != 0) {
      internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
                ((RepeatedPtrFieldBase *)&to_msg[4]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[4]._internal_metadata_);
    }
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 7) == 0) goto LAB_0020f90d;
    if ((unaff_EBP & 1) != 0) {
      pp_Var1 = from_msg[6]._vptr_MessageLite;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      value = (string *)((ulong)pp_Var1 & 0xfffffffffffffffc);
      pMVar4 = to_msg + 6;
      arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)arena & 1) != 0) goto LAB_0020f95f;
      goto LAB_0020f8cc;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    pMVar4 = (MessageLite *)from_msg[6]._internal_metadata_.ptr_;
    if (pMVar4 == (MessageLite *)0x0) {
      MergeImpl((EnumDescriptorProto *)&stack0xffffffffffffffd0);
    }
    to_msg_00 = (MessageLite *)to_msg[6]._internal_metadata_.ptr_;
    if (to_msg_00 == (MessageLite *)0x0) {
      pvVar3 = Arena::CopyConstruct<google::protobuf::EnumOptions>(arena_00,pMVar4);
      to_msg[6]._internal_metadata_.ptr_ = (intptr_t)pvVar3;
    }
    else {
      EnumOptions::MergeImpl(to_msg_00,pMVar4);
    }
  }
  if ((unaff_EBP & 4) != 0) {
    *(undefined4 *)&to_msg[7]._vptr_MessageLite = *(undefined4 *)&from_msg[7]._vptr_MessageLite;
  }
LAB_0020f90d:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void EnumDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<EnumDescriptorProto*>(&to_msg);
  auto& from = static_cast<const EnumDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_value()->MergeFrom(
      from._internal_value());
  _this->_internal_mutable_reserved_range()->MergeFrom(
      from._internal_reserved_range());
  _this->_internal_mutable_reserved_name()->MergeFrom(from._internal_reserved_name());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.visibility_ = from._impl_.visibility_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}